

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::tracker_connection::tracker_connection
          (tracker_connection *this,tracker_manager *man,tracker_request *req,io_context *ios,
          weak_ptr<libtorrent::aux::request_callback> *r)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int64_t iVar7;
  int64_t iVar8;
  int64_t iVar9;
  int64_t iVar10;
  pointer paVar11;
  pointer paVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  context *pcVar15;
  uint16_t uVar16;
  event_t eVar17;
  tracker_request_flags_t tVar18;
  uint32_t uVar19;
  bool bVar20;
  undefined6 uVar21;
  
  timeout_handler::timeout_handler(&this->super_timeout_handler,ios);
  (this->super_timeout_handler)._vptr_timeout_handler =
       (_func_int **)&PTR___cxa_pure_virtual_004e0ed8;
  paVar1 = &(this->m_req).url.field_2;
  (this->m_req).url._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (req->url)._M_dataplus._M_p;
  paVar2 = &(req->url).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(req->url).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_req).url.field_2 + 8) = uVar4;
  }
  else {
    (this->m_req).url._M_dataplus._M_p = pcVar3;
    (this->m_req).url.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_req).url._M_string_length = (req->url)._M_string_length;
  (req->url)._M_dataplus._M_p = (pointer)paVar2;
  (req->url)._M_string_length = 0;
  (req->url).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->m_req).trackerid.field_2;
  (this->m_req).trackerid._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (req->trackerid)._M_dataplus._M_p;
  paVar2 = &(req->trackerid).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(req->trackerid).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_req).trackerid.field_2 + 8) = uVar4;
  }
  else {
    (this->m_req).trackerid._M_dataplus._M_p = pcVar3;
    (this->m_req).trackerid.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_req).trackerid._M_string_length = (req->trackerid)._M_string_length;
  (req->trackerid)._M_dataplus._M_p = (pointer)paVar2;
  (req->trackerid)._M_string_length = 0;
  (req->trackerid).field_2._M_local_buf[0] = '\0';
  (this->m_req).filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (req->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var6 = (req->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (req->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_req).filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar5;
  (this->m_req).filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var6;
  (req->filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_req).num_want = req->num_want;
  iVar7 = req->downloaded;
  iVar8 = req->uploaded;
  iVar9 = req->left;
  iVar10 = req->corrupt;
  uVar16 = req->listen_port;
  eVar17 = req->event;
  tVar18.m_val = (req->kind).m_val;
  uVar19 = req->key;
  (this->m_req).redundant = req->redundant;
  (this->m_req).listen_port = uVar16;
  (this->m_req).event = eVar17;
  (this->m_req).kind = (tracker_request_flags_t)tVar18.m_val;
  (this->m_req).key = uVar19;
  (this->m_req).left = iVar9;
  (this->m_req).corrupt = iVar10;
  (this->m_req).downloaded = iVar7;
  (this->m_req).uploaded = iVar8;
  paVar11 = (req->ipv6).
            super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_req).ipv6.
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (req->ipv6).
       super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_req).ipv6.
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_finish = paVar11;
  (this->m_req).ipv6.
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (req->ipv6).
       super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (req->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (req->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (req->ipv6).
  super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar12 = (req->ipv4).
            super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_req).ipv4.
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (req->ipv4).
       super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_req).ipv4.
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_finish = paVar12;
  (this->m_req).ipv4.
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (req->ipv4).
       super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (req->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (req->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (req->ipv4).
  super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)((this->m_req).pid.m_number._M_elems + 3) =
       *(undefined8 *)((req->pid).m_number._M_elems + 3);
  uVar4 = *(undefined8 *)(req->info_hash).m_number._M_elems;
  uVar13 = *(undefined8 *)((req->info_hash).m_number._M_elems + 2);
  uVar14 = *(undefined8 *)((req->pid).m_number._M_elems + 1);
  *(undefined8 *)((this->m_req).info_hash.m_number._M_elems + 4) =
       *(undefined8 *)((req->info_hash).m_number._M_elems + 4);
  *(undefined8 *)((this->m_req).pid.m_number._M_elems + 1) = uVar14;
  *(undefined8 *)(this->m_req).info_hash.m_number._M_elems = uVar4;
  *(undefined8 *)((this->m_req).info_hash.m_number._M_elems + 2) = uVar13;
  p_Var6 = (req->outgoing_socket).m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_req).outgoing_socket.m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (req->outgoing_socket).m_sock.
       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->m_req).outgoing_socket.m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var6;
  (req->outgoing_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (req->outgoing_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_req).i2pconn = req->i2pconn;
  bVar20 = req->triggered_manually;
  uVar21 = *(undefined6 *)&req->field_0xf2;
  pcVar15 = req->ssl_ctx;
  (this->m_req).private_torrent = req->private_torrent;
  (this->m_req).triggered_manually = bVar20;
  *(undefined6 *)&(this->m_req).field_0xf2 = uVar21;
  (this->m_req).ssl_ctx = pcVar15;
  p_Var6 = (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_requester).
  super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->m_requester).
  super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var6;
  (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (r->super___weak_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_man = man;
  return;
}

Assistant:

tracker_connection::tracker_connection(
		tracker_manager& man
		, tracker_request req
		, io_context& ios
		, std::weak_ptr<request_callback> r)
		: timeout_handler(ios)
		, m_req(std::move(req))
		, m_requester(std::move(r))
		, m_man(man)
	{}